

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_tree.hh
# Opt level: O0

pre_order_iterator __thiscall
kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::
append_child<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
          (tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>> *this,
          pre_order_iterator position,Node *x)

{
  tree_node_<htmlcxx2::HTML::Node> *__p;
  undefined8 extraout_RDX;
  tree_node_<htmlcxx2::HTML::Node> *ptVar1;
  pre_order_iterator pVar2;
  tree_node *tmp;
  Node *x_local;
  tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_> *this_local;
  pre_order_iterator position_local;
  undefined1 local_10;
  
  ptVar1 = position.super_iterator_base.node;
  position_local.super_iterator_base.node._0_1_ =
       position.super_iterator_base.skip_current_children_;
  if (ptVar1 == *(tree_node_<htmlcxx2::HTML::Node> **)this) {
    __assert_fail("position.node!=head",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/./htmlcxx2/kp_tree.hh"
                  ,0x35d,
                  "iter kp::tree<htmlcxx2::HTML::Node>::append_child(iter, const T &) [T = htmlcxx2::HTML::Node, tree_node_allocator = std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>, iter = kp::tree<htmlcxx2::HTML::Node>::pre_order_iterator]"
                 );
  }
  if (ptVar1 != *(tree_node_<htmlcxx2::HTML::Node> **)(this + 8)) {
    if (ptVar1 != (tree_node_<htmlcxx2::HTML::Node> *)0x0) {
      __p = __gnu_cxx::new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>::allocate
                      ((new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>_> *)(this + 0x10),1,
                       (void *)0x0);
      __gnu_cxx::new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>>::
      construct<kp::tree_node_<htmlcxx2::HTML::Node>,htmlcxx2::HTML::Node_const&>
                ((new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>> *)(this + 0x10),__p,x);
      __p->first_child = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      __p->last_child = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      __p->parent = ptVar1;
      if (ptVar1->last_child == (tree_node_<htmlcxx2::HTML::Node> *)0x0) {
        ptVar1->first_child = __p;
      }
      else {
        ptVar1->last_child->next_sibling = __p;
      }
      __p->prev_sibling = ptVar1->last_child;
      ptVar1->last_child = __p;
      __p->next_sibling = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::
      pre_order_iterator::pre_order_iterator
                ((pre_order_iterator *)&position_local.super_iterator_base.skip_current_children_,
                 __p);
      pVar2.super_iterator_base._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      pVar2.super_iterator_base.skip_current_children_ = (bool)local_10;
      pVar2.super_iterator_base.node = (tree_node *)position_local.super_iterator_base._8_8_;
      return (pre_order_iterator)pVar2.super_iterator_base;
    }
    __assert_fail("position.node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/./htmlcxx2/kp_tree.hh"
                  ,0x35f,
                  "iter kp::tree<htmlcxx2::HTML::Node>::append_child(iter, const T &) [T = htmlcxx2::HTML::Node, tree_node_allocator = std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>, iter = kp::tree<htmlcxx2::HTML::Node>::pre_order_iterator]"
                 );
  }
  __assert_fail("position.node!=feet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/./htmlcxx2/kp_tree.hh"
                ,0x35e,
                "iter kp::tree<htmlcxx2::HTML::Node>::append_child(iter, const T &) [T = htmlcxx2::HTML::Node, tree_node_allocator = std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>, iter = kp::tree<htmlcxx2::HTML::Node>::pre_order_iterator]"
               );
}

Assistant:

iter tree<T, tree_node_allocator>::append_child(iter position, const T& x)
    {
    // If your program fails here you probably used 'append_child' to add the top
    // node to an empty tree. From version 1.45 the top element should be added
    // using 'insert'. See the documentation for further information, and sorry about
    // the API change.
    assert(position.node!=head);
    assert(position.node!=feet);
    assert(position.node);

    tree_node* tmp = alloc_.allocate(1,0);
    alloc_.construct(tmp, x);
//    kp::constructor(&tmp->data, x);
    tmp->first_child=0;
    tmp->last_child=0;

    tmp->parent=position.node;
    if(position.node->last_child!=0) {
        position.node->last_child->next_sibling=tmp;
        }
    else {
        position.node->first_child=tmp;
        }
    tmp->prev_sibling=position.node->last_child;
    position.node->last_child=tmp;
    tmp->next_sibling=0;
    return tmp;
    }